

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.hpp
# Opt level: O3

enable_if_t<std::is_unsigned<unsigned_short>::value,_unsigned_short>
burst::divceil<unsigned_short,signed_char>(Integer<unsigned_short> n,Integer<signed_char> divisor)

{
  enable_if_t<std::is_unsigned<unsigned_short>::value,_unsigned_short> eVar1;
  domain_error *this;
  
  if ('\0' < divisor) {
    if (n == 0) {
      eVar1 = 0;
    }
    else {
      eVar1 = (short)((n - 1 & 0xffff) / (uint)(byte)divisor) + 1;
    }
    return eVar1;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,anon_var_dwarf_1f0b1);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr auto divceil (Integer<I> n, Integer<J> divisor)
    {
        if (divisor > 0)
        {
            return detail::divceil_impl(n, divisor);
        }
        else
        {
            throw std::domain_error("Целая часть от деления на неположительное число не определена.");
        }
    }